

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyDefinition.cpp
# Opt level: O3

bool __thiscall
Rml::PropertyDefinition::GetValue(PropertyDefinition *this,String *value,Property *property)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Unit UVar3;
  ulong uVar4;
  ulong *puVar5;
  int iVar6;
  uint uVar7;
  PropertyParser *pPVar8;
  NodePtr pDVar9;
  pointer pPVar10;
  uint8_t *puVar11;
  ulong *puVar12;
  int iVar13;
  ulong uVar14;
  const_iterator cVar15;
  String result;
  String local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  String *local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  paVar1 = &local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  local_78._M_dataplus._M_p = (pointer)paVar1;
  Variant::
  GetInto<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&property->value,&local_78);
  paVar2 = &local_98.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p == paVar1) {
    local_98.field_2._8_8_ = local_78.field_2._8_8_;
    local_98._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_98._M_dataplus._M_p = local_78._M_dataplus._M_p;
  }
  local_98.field_2._M_allocated_capacity._1_7_ = local_78.field_2._M_allocated_capacity._1_7_;
  local_98.field_2._M_local_buf[0] = local_78.field_2._M_local_buf[0];
  local_98._M_string_length = local_78._M_string_length;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  local_78._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::operator=((string *)value,(string *)&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                             local_78.field_2._M_local_buf[0]) + 1);
  }
  UVar3 = property->unit;
  if (UVar3 != KEYWORD) {
    local_48 = 0;
    local_40 = 0;
    local_98._M_dataplus._M_p = (pointer)paVar2;
    local_50 = &local_40;
    ::std::__cxx11::string::_M_construct<char*>((string *)&local_98,&local_40,&local_40);
    TypeConverter<Rml::Unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::Convert(&property->unit,&local_98);
    ::std::__cxx11::string::_M_append((char *)value,(ulong)local_98._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    goto LAB_0024b849;
  }
  iVar13 = property->parser_index;
  local_58 = value;
  if ((iVar13 < 0) ||
     (iVar6 = (int)((ulong)((long)(this->parsers).
                                  super__Vector_base<Rml::PropertyDefinition::ParserState,_std::allocator<Rml::PropertyDefinition::ParserState>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->parsers).
                                 super__Vector_base<Rml::PropertyDefinition::ParserState,_std::allocator<Rml::PropertyDefinition::ParserState>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3),
     SBORROW4(iVar13,iVar6 * -0x49249249) == iVar13 + iVar6 * 0x49249249 < 0)) {
    local_98._M_dataplus._M_p = (pointer)paVar2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"keyword","");
    pPVar8 = StyleSheetSpecification::GetParser(&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    pPVar10 = (this->parsers).
              super__Vector_base<Rml::PropertyDefinition::ParserState,_std::allocator<Rml::PropertyDefinition::ParserState>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar7 = (int)((long)(this->parsers).
                        super__Vector_base<Rml::PropertyDefinition::ParserState,_std::allocator<Rml::PropertyDefinition::ParserState>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar10 >> 3) *
            -0x49249249;
    if (0 < (int)uVar7) {
      uVar14 = 0;
      do {
        if (pPVar10->parser == pPVar8) {
          iVar13 = (int)uVar14;
          goto LAB_0024b7b0;
        }
        uVar14 = uVar14 + 1;
        pPVar10 = pPVar10 + 1;
      } while ((uVar7 & 0x7fffffff) != uVar14);
    }
    if (iVar13 < 0) goto LAB_0024b849;
LAB_0024b7b0:
    if ((int)uVar7 <= iVar13) goto LAB_0024b849;
  }
  local_98._M_dataplus._M_p = (pointer)((ulong)local_98._M_dataplus._M_p._4_4_ << 0x20);
  Variant::GetInto<int,_0>(&property->value,(int *)&local_98);
  iVar6 = (int)local_98._M_dataplus._M_p;
  pPVar10 = (this->parsers).
            super__Vector_base<Rml::PropertyDefinition::ParserState,_std::allocator<Rml::PropertyDefinition::ParserState>_>
            ._M_impl.super__Vector_impl_data._M_start;
  cVar15 = robin_hood::detail::
           Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::cbegin(&pPVar10[iVar13].parameters);
  while( true ) {
    puVar11 = cVar15.mInfo;
    pDVar9 = cVar15.mKeyVals;
    if (pDVar9 == (NodePtr)pPVar10[iVar13].parameters.mInfo) break;
    if ((pDVar9->mData).second == iVar6) {
      ::std::__cxx11::string::_M_assign((string *)local_58);
      break;
    }
    pDVar9 = pDVar9 + 1;
    uVar14 = *(ulong *)(puVar11 + 1);
    if (uVar14 == 0) {
      puVar5 = (ulong *)(puVar11 + 9);
      do {
        puVar12 = puVar5;
        pDVar9 = pDVar9 + 8;
        uVar14 = *puVar12;
        puVar5 = puVar12 + 1;
      } while (uVar14 == 0);
    }
    else {
      puVar12 = (ulong *)(puVar11 + 1);
    }
    uVar4 = 0;
    if (uVar14 != 0) {
      for (; (uVar14 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
      }
    }
    uVar14 = uVar4 >> 3 & 0x1fffffff;
    cVar15.mInfo = (uint8_t *)((long)puVar12 + uVar14);
    cVar15.mKeyVals = pDVar9 + uVar14;
  }
LAB_0024b849:
  return UVar3 != KEYWORD;
}

Assistant:

bool PropertyDefinition::GetValue(String& value, const Property& property) const
{
	value = property.value.Get<String>();

	switch (property.unit)
	{
	case Unit::KEYWORD:
	{
		int parser_index = property.parser_index;
		if (parser_index < 0 || parser_index >= (int)parsers.size())
		{
			// Look for the keyword parser in the property's list of parsers
			const auto* keyword_parser = StyleSheetSpecification::GetParser("keyword");
			for (int i = 0; i < (int)parsers.size(); i++)
			{
				if (parsers[i].parser == keyword_parser)
				{
					parser_index = i;
					break;
				}
			}
			// If we couldn't find it, exit now
			if (parser_index < 0 || parser_index >= (int)parsers.size())
				return false;
		}

		int keyword = property.value.Get<int>();
		for (const auto& name_keyword : parsers[parser_index].parameters)
		{
			if (name_keyword.second == keyword)
			{
				value = name_keyword.first;
				break;
			}
		}

		return false;
	}
	break;

	default: value += ToString(property.unit); break;
	}

	return true;
}